

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::DOMNodeImpl::isEqualNode(DOMNodeImpl *this,DOMNode *arg)

{
  DOMNode *pDVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  
  if (arg != (DOMNode *)0x0) {
    pDVar1 = this->fContainingNode;
    if (pDVar1 == arg) {
      return true;
    }
    iVar3 = (*arg->_vptr_DOMNode[4])(arg);
    iVar4 = (*pDVar1->_vptr_DOMNode[4])(pDVar1);
    if (iVar3 == iVar4) {
      iVar3 = (*pDVar1->_vptr_DOMNode[2])(pDVar1);
      iVar4 = (*arg->_vptr_DOMNode[2])(arg);
      bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar3),
                                (XMLCh *)CONCAT44(extraout_var_00,iVar4));
      if (bVar2) {
        iVar3 = (*pDVar1->_vptr_DOMNode[0x18])(pDVar1);
        iVar4 = (*arg->_vptr_DOMNode[0x18])(arg);
        bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar3),
                                  (XMLCh *)CONCAT44(extraout_var_02,iVar4));
        if (bVar2) {
          iVar3 = (*pDVar1->_vptr_DOMNode[0x16])(pDVar1);
          iVar4 = (*arg->_vptr_DOMNode[0x16])(arg);
          bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_03,iVar3),
                                    (XMLCh *)CONCAT44(extraout_var_04,iVar4));
          if (bVar2) {
            iVar3 = (*pDVar1->_vptr_DOMNode[0x17])(pDVar1);
            iVar4 = (*arg->_vptr_DOMNode[0x17])(arg);
            bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_05,iVar3),
                                      (XMLCh *)CONCAT44(extraout_var_06,iVar4));
            if (bVar2) {
              iVar3 = (*pDVar1->_vptr_DOMNode[3])(pDVar1);
              iVar4 = (*arg->_vptr_DOMNode[3])(arg);
              bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_07,iVar3),
                                        (XMLCh *)CONCAT44(extraout_var_08,iVar4));
              return bVar2;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool DOMNodeImpl::isEqualNode(const DOMNode* arg) const
{
    if (!arg)
        return false;

    if (isSameNode(arg)) {
        return true;
    }

    const DOMNode* thisNode = getContainingNode();

    if (arg->getNodeType() != thisNode->getNodeType()) {
        return false;
    }

    // the compareString will check null string as well
    if (!XMLString::equals(thisNode->getNodeName(), arg->getNodeName())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getLocalName(),arg->getLocalName())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getNamespaceURI(), arg->getNamespaceURI())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getPrefix(), arg->getPrefix())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getNodeValue(), arg->getNodeValue())) {
        return false;
    }

    return true;
}